

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measure.h
# Opt level: O0

ostream * __thiscall Measure<int>::Print(Measure<int> *this,ostream *out)

{
  Measure<int> *in_RSI;
  char (*in_RDI) [40];
  long *in_stack_ffffffffffffffc8;
  char *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  
  args_1 = *in_RDI + 8;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 1);
  std::chrono::_V2::system_clock::to_time_t(&in_RSI->time);
  spdlog::info<char[40],std::__cxx11::string,MetricTypes::MetricType,long,int>
            (in_RDI,args,(MetricType *)args_1,in_stack_ffffffffffffffc8,(int *)0x13c8ce);
  PrintTags(in_RSI);
  return (ostream *)in_RSI;
}

Assistant:

std::ostream& Print(std::ostream& out) const  {
        spdlog::info("name: {}, type: {}, time: {}, value: {}", this->name, this->type, system_clock::to_time_t(this->time), this->value);
        PrintTags();
        return out;
    }